

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase847::run(TestCase847 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *pOVar3;
  PromiseFulfiller<void> *pPVar4;
  NullableValue<kj::Exception> *other;
  Exception *pEVar5;
  char *params;
  nfds_t __nfds;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  nfds_t __nfds_02;
  anon_class_16_2_2e920dcd *func;
  ulong uVar6;
  bool local_80d;
  int local_80c;
  bool _kj_shouldLog_11;
  DebugExpression<unsigned_int_&> DStack_808;
  undefined1 local_800 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_10;
  undefined1 local_7d0 [6];
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_7c0;
  bool local_7aa;
  DebugExpression<bool> local_7a9;
  Exception *pEStack_7a8;
  DebugExpression<bool> _kjCondition_9;
  Exception *e;
  undefined1 *local_798;
  Maybe<kj::Exception> local_790;
  undefined1 local_5f8 [8];
  NullableValue<kj::Exception> _e880;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int_&> DStack_458;
  undefined1 local_450 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_8;
  undefined1 auStack_420 [6];
  bool _kj_shouldLog_7;
  uint local_410;
  bool local_408;
  DebugExpression<bool> local_407;
  undefined1 local_406;
  bool local_405;
  int local_404;
  DebugExpression<bool> _kjCondition_7;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int_&> DStack_400;
  undefined1 local_3f8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  undefined1 auStack_3c8 [6];
  bool _kj_shouldLog_5;
  uint local_3b8;
  bool local_3aa;
  DebugExpression<bool> local_3a9;
  undefined1 local_3a8 [7];
  DebugExpression<bool> _kjCondition_5;
  Exception local_390;
  bool local_1fd;
  int local_1fc;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int_&> DStack_1f8;
  undefined1 local_1f0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_4;
  undefined1 auStack_1c0 [6];
  bool _kj_shouldLog_3;
  char (*local_1b0) [15];
  bool local_1a8;
  DebugExpression<bool> local_1a7;
  undefined1 local_1a6;
  bool local_1a5;
  int local_1a4;
  DebugExpression<bool> _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int_&> DStack_1a0;
  undefined1 local_198 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_2;
  undefined1 auStack_168 [6];
  bool _kj_shouldLog_1;
  uint local_158;
  bool local_150;
  DebugExpression<bool> local_14f;
  undefined1 local_14e;
  bool local_14d;
  int local_14c;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_148;
  undefined1 local_140 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint i;
  char *pcStack_108;
  uint local_100;
  uint uStack_fc;
  undefined1 local_f8 [8];
  Promise<void> promise;
  Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *fulfillers;
  Pafs pafs;
  uint tasksCompleted;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase847 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  pafs.fulfillers.disposer._0_4_ = 0;
  makeCompletionCountingPafs((Pafs *)&fulfillers,5,(uint *)&pafs.fulfillers.disposer);
  promise.super_PromiseBase.node.ptr = (PromiseBase)&pafs.promises.disposer;
  mv<kj::Array<kj::Promise<void>>>((Array<kj::Promise<void>_> *)&fulfillers);
  SourceLocation::SourceLocation
            ((SourceLocation *)&i,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x356,0x1b);
  location.function = pcStack_108;
  location.fileName = _i;
  location.lineNumber = local_100;
  location.columnNumber = uStack_fc;
  joinPromises((Array<kj::Promise<void>_> *)local_f8,location);
  _kjCondition.result = false;
  _kjCondition._33_3_ = 0;
  DStack_148 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  local_14c = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_140,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffeb8,&local_14c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
  if (!bVar1) {
    local_14d = kj::_::Debug::shouldLog(ERROR);
    while (local_14d != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x35a,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_140);
      local_14d = false;
    }
  }
  uVar6 = (ulong)(uint)_kjCondition._32_4_;
  _kjCondition._32_4_ = _kjCondition._32_4_ + 1;
  pOVar3 = Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator[]
                     ((Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                      promise.super_PromiseBase.node.ptr,uVar6);
  pPVar4 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(pOVar3);
  (*(pPVar4->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar4,&local_14e);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_168,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x35e,0x27);
  iVar2 = Promise<void>::poll((Promise<void> *)local_f8,(pollfd *)local_a8,__nfds,local_158);
  local_150 = (bool)(~(byte)iVar2 & 1);
  local_14f = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_150);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_14f);
  if (!bVar1) {
    _kjCondition_2._38_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._38_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x35e,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
                 (char (*) [42])"failed: expected !promise.poll(waitScope)",&local_14f);
      _kjCondition_2._38_1_ = 0;
    }
  }
  DStack_1a0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  local_1a4 = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_198,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe60,&local_1a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  if (!bVar1) {
    local_1a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a5 != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x35f,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_198);
      local_1a5 = false;
    }
  }
  uVar6 = (ulong)(uint)_kjCondition._32_4_;
  _kjCondition._32_4_ = _kjCondition._32_4_ + 1;
  pOVar3 = Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator[]
                     ((Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                      promise.super_PromiseBase.node.ptr,uVar6);
  pPVar4 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(pOVar3);
  (*(pPVar4->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar4,&local_1a6);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x362,0x27);
  iVar2 = Promise<void>::poll((Promise<void> *)local_f8,(pollfd *)local_a8,__nfds_00,(int)local_1b0)
  ;
  local_1a8 = (bool)(~(byte)iVar2 & 1);
  local_1a7 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a8);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1a7);
  params = *local_1b0;
  if (!bVar1) {
    _kjCondition_4._38_1_ = kj::_::Debug::shouldLog(ERROR);
    params = *local_1b0;
    while (_kjCondition_4._38_1_ != '\0') {
      params = "\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition";
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x362,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
                 (char (*) [42])"failed: expected !promise.poll(waitScope)",&local_1a7);
      _kjCondition_4._38_1_ = 0;
    }
  }
  DStack_1f8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  local_1fc = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_1f0,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe08,&local_1fc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
  if (!bVar1) {
    local_1fd = kj::_::Debug::shouldLog(ERROR);
    while (local_1fd != false) {
      params = "\"failed: expected \" \"tasksCompleted == 0\", _kjCondition";
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x363,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_1f0);
      local_1fd = false;
    }
  }
  uVar6 = (ulong)(uint)_kjCondition._32_4_;
  _kjCondition._32_4_ = _kjCondition._32_4_ + 1;
  pOVar3 = Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator[]
                     ((Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                      promise.super_PromiseBase.node.ptr,uVar6);
  pPVar4 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(pOVar3);
  kj::_::Debug::makeDescription<char_const(&)[15]>
            ((String *)local_3a8,(Debug *)"\"Test exception\"","Test exception",
             (char (*) [15])params);
  Exception::Exception
            (&local_390,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x366,(String *)local_3a8);
  (**(pPVar4->super_PromiseRejector)._vptr_PromiseRejector)(pPVar4,&local_390);
  Exception::~Exception(&local_390);
  String::~String((String *)local_3a8);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_3c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x367,0x27);
  iVar2 = Promise<void>::poll((Promise<void> *)local_f8,(pollfd *)local_a8,__nfds_01,local_3b8);
  local_3aa = (bool)(~(byte)iVar2 & 1);
  local_3a9 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3aa);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3a9);
  if (!bVar1) {
    _kjCondition_6._38_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._38_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x367,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
                 (char (*) [42])"failed: expected !promise.poll(waitScope)",&local_3a9);
      _kjCondition_6._38_1_ = 0;
    }
  }
  DStack_400 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  local_404 = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_3f8,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffc00,&local_404);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f8);
  if (!bVar1) {
    local_405 = kj::_::Debug::shouldLog(ERROR);
    while (local_405 != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x368,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_3f8);
      local_405 = false;
    }
  }
  uVar6 = (ulong)(uint)_kjCondition._32_4_;
  _kjCondition._32_4_ = _kjCondition._32_4_ + 1;
  pOVar3 = Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator[]
                     ((Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                      promise.super_PromiseBase.node.ptr,uVar6);
  pPVar4 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(pOVar3);
  (*(pPVar4->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar4,&local_406);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_420,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x36b,0x27);
  iVar2 = Promise<void>::poll((Promise<void> *)local_f8,(pollfd *)local_a8,__nfds_02,local_410);
  local_408 = (bool)(~(byte)iVar2 & 1);
  local_407 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_408);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_407);
  if (!bVar1) {
    _kjCondition_8._38_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._38_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x36b,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
                 (char (*) [42])"failed: expected !promise.poll(waitScope)",&local_407);
      _kjCondition_8._38_1_ = 0;
    }
  }
  DStack_458 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  _e880.field_1._396_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_450,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffba8,
             (int *)((long)&_e880.field_1 + 0x18c));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_450);
  if (!bVar1) {
    _e880.field_1._395_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_e880.field_1._395_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x36c,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_450);
      _e880.field_1._395_1_ = 0;
    }
  }
  uVar6 = (ulong)(uint)_kjCondition._32_4_;
  _kjCondition._32_4_ = _kjCondition._32_4_ + 1;
  pOVar3 = Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator[]
                     ((Array<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                      promise.super_PromiseBase.node.ptr,uVar6);
  pPVar4 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(pOVar3);
  (*(pPVar4->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pPVar4,(undefined1 *)((long)&_e880.field_1 + 0x18a));
  e = (Exception *)local_f8;
  local_798 = local_a8;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase847::run()::__0>
            (&local_790,(kj *)&e,func);
  other = kj::_::readMaybe<kj::Exception>(&local_790);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_5f8,other);
  Maybe<kj::Exception>::~Maybe(&local_790);
  pEVar5 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_5f8);
  if (pEVar5 == (Exception *)0x0) {
    _kjCondition_10._38_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_10._38_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x370,ERROR,"\"code did not throw: \" \"promise.wait(waitScope)\"",
                 (char (*) [44])"code did not throw: promise.wait(waitScope)");
      _kjCondition_10._38_1_ = 0;
    }
  }
  else {
    pEStack_7a8 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_5f8);
    local_7c0 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_7a8);
    StringPtr::StringPtr((StringPtr *)local_7d0,"Test exception");
    local_7aa = StringPtr::contains((StringPtr *)&local_7c0,(StringPtr *)local_7d0);
    local_7a9 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7aa);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_7a9);
    if (!bVar1) {
      _kjCondition_10._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_10._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[63],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x370,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"Test exception\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [63])
                    "failed: expected e.getDescription().contains(\"Test exception\")",&local_7a9,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_7a8);
        _kjCondition_10._39_1_ = 0;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_5f8);
  DStack_808 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&pafs.fulfillers.disposer);
  local_80c = 4;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_800,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff7f8,&local_80c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_800);
  if (!bVar1) {
    local_80d = kj::_::Debug::shouldLog(ERROR);
    while (local_80d != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x371,ERROR,"\"failed: expected \" \"tasksCompleted == 4\", _kjCondition",
                 (char (*) [37])"failed: expected tasksCompleted == 4",
                 (DebugComparison<unsigned_int_&,_int> *)local_800);
      local_80d = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_f8);
  Pafs::~Pafs((Pafs *)&fulfillers);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, ArrayJoinException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromises(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are not completed early.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // Rejected tasks do not fail-fast.
    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // The final fulfillment makes the promise ready.
    fulfillers[i++]->fulfill();
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == 4);
  }
}